

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

timestamp_t __thiscall
duckdb::DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
          (DateTruncBinaryOperator *this,string_t specifier,date_t date)

{
  DatePartSpecifier DVar1;
  bool bVar2;
  timestamp_t tVar3;
  NotImplementedException *this_00;
  date_t input;
  allocator local_69;
  string local_68;
  string local_48;
  string_t specifier_local;
  
  specifier_local.value.pointer.ptr = (char *)specifier.value._0_8_;
  input.days = specifier.value._8_4_;
  specifier_local.value._0_8_ = this;
  string_t::GetString_abi_cxx11_(&local_68,&specifier_local);
  DVar1 = GetDatePartSpecifier(&local_68);
  bVar2 = Value::IsFinite<duckdb::date_t>(input);
  if (bVar2) {
    switch(DVar1) {
    case BEGIN_BIGINT:
      tVar3 = DateTrunc::YearOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case MONTH:
      tVar3 = DateTrunc::MonthOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case DAY:
    case MICROSECONDS:
    case MILLISECONDS:
    case SECOND:
    case MINUTE:
    case HOUR:
    case DOW:
    case ISODOW:
    case DOY:
    case BEGIN_DOUBLE:
    case JULIAN_DAY:
      tVar3 = DateTrunc::DayOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case DECADE:
      tVar3 = DateTrunc::DecadeOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case CENTURY:
      tVar3 = DateTrunc::CenturyOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case MILLENNIUM:
      tVar3 = DateTrunc::MillenniumOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case WEEK:
    case YEARWEEK:
      tVar3 = DateTrunc::WeekOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case ISOYEAR:
      tVar3 = DateTrunc::ISOYearOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case QUARTER:
      tVar3 = DateTrunc::QuarterOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Specifier type not implemented for DATETRUNC",&local_69);
      NotImplementedException::NotImplementedException(this_00,&local_48);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    tVar3 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
  }
  ::std::__cxx11::string::~string((string *)&local_68);
  return (timestamp_t)tVar3.value;
}

Assistant:

static inline TR Operation(TA specifier, TB date) {
		return TruncateElement<TB, TR>(GetDatePartSpecifier(specifier.GetString()), date);
	}